

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::local_context::local_context
          (local_context *this,context *ctx,uint thread_id_,result_type_conflict seed)

{
  int iVar1;
  double dVar2;
  unsigned_long __res;
  
  (this->rng)._M_x = seed % 0x7fffffff + (ulong)(seed % 0x7fffffff == 0);
  dVar2 = (ctx->parameters).init_crossover_solution_selection_stddev;
  (this->choose_sol_dist)._M_param._M_mean =
       (ctx->parameters).init_crossover_solution_selection_mean;
  (this->choose_sol_dist)._M_param._M_stddev = dVar2;
  (this->choose_sol_dist)._M_saved = 0.0;
  (this->choose_sol_dist)._M_saved_available = false;
  dVar2 = (ctx->parameters).init_mutation_variable_stddev;
  (this->variable_p_dist)._M_param._M_mean = (ctx->parameters).init_mutation_variable_mean;
  (this->variable_p_dist)._M_param._M_stddev = dVar2;
  (this->variable_p_dist)._M_saved = 0.0;
  (this->variable_p_dist)._M_saved_available = false;
  dVar2 = (ctx->parameters).init_mutation_value_stddev;
  (this->value_p_dist)._M_param._M_mean = (ctx->parameters).init_mutation_value_mean;
  (this->value_p_dist)._M_param._M_stddev = dVar2;
  (this->value_p_dist)._M_saved = 0.0;
  (this->value_p_dist)._M_saved_available = false;
  iVar1 = (ctx->parameters).init_population_size;
  (this->bad_solution_choose)._M_param._M_a = iVar1 / 5;
  (this->bad_solution_choose)._M_param._M_b = iVar1 + -1;
  (this->crossover_dist)._M_param._M_a = 0;
  (this->crossover_dist)._M_param._M_b = 0xffffffffffffffff;
  (this->crossover_bastert_insertion)._M_param._M_p =
       (ctx->parameters).init_crossover_bastert_insertion;
  this->init_kappa_improve_start = (ctx->parameters).init_kappa_improve_start;
  this->init_kappa_improve_increase = (ctx->parameters).init_kappa_improve_increase;
  this->init_kappa_improve_stop = (ctx->parameters).init_kappa_improve_stop;
  this->thread_id = thread_id_;
  return;
}

Assistant:

local_context(const context& ctx,
                  const unsigned thread_id_,
                  const random_engine::result_type seed)
      : rng(seed)
      , choose_sol_dist(
          ctx.parameters.init_crossover_solution_selection_mean,
          ctx.parameters.init_crossover_solution_selection_stddev)
      , variable_p_dist(ctx.parameters.init_mutation_variable_mean,
                        ctx.parameters.init_mutation_variable_stddev)
      , value_p_dist(ctx.parameters.init_mutation_value_mean,
                     ctx.parameters.init_mutation_value_stddev)
      , bad_solution_choose(ctx.parameters.init_population_size / 5,
                            ctx.parameters.init_population_size - 1)
      , crossover_dist(0)
      , crossover_bastert_insertion(
          ctx.parameters.init_crossover_bastert_insertion)
      , init_kappa_improve_start(ctx.parameters.init_kappa_improve_start)
      , init_kappa_improve_increase(ctx.parameters.init_kappa_improve_increase)
      , init_kappa_improve_stop(ctx.parameters.init_kappa_improve_stop)
      , thread_id(thread_id_)
    {}